

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall UI::State::changeColorScheme(State *this,bool inc)

{
  int iVar1;
  ImGuiStyle *pIVar2;
  byte in_SIL;
  long in_RDI;
  ImVec4 *colors;
  ImVec4 local_1c8;
  ImVec4 local_1b8;
  ImVec4 local_1a8;
  ImVec4 local_198;
  ImVec4 local_188;
  ImVec4 local_178;
  ImVec4 local_168;
  ImVec4 local_158;
  ImVec4 local_148;
  ImVec4 local_138;
  ImVec4 local_128;
  ImVec4 local_118;
  ImVec4 local_108;
  ImVec4 local_f8;
  ImVec4 local_e8;
  ImVec4 local_d8;
  ImVec4 local_c8;
  ImVec4 local_b8;
  ImVec4 local_a8;
  ImVec4 local_98;
  ImVec4 local_88;
  ImVec4 local_78;
  ImVec4 local_68;
  ImVec4 local_58;
  ImVec4 local_48;
  ImVec4 local_38;
  ImVec4 local_28;
  ImVec4 *local_18;
  byte local_9;
  
  local_9 = in_SIL & 1;
  if (local_9 != 0) {
    *(int *)(in_RDI + 8) = (*(int *)(in_RDI + 8) + 1) % 3;
  }
  pIVar2 = ImGui::GetStyle();
  local_18 = pIVar2->Colors;
  iVar1 = *(int *)(in_RDI + 8);
  if (iVar1 == 0) {
    ImVec4::ImVec4(&local_28,0.0,0.0,0.0,1.0);
    local_18->x = local_28.x;
    local_18->y = local_28.y;
    local_18->z = local_28.z;
    local_18->w = local_28.w;
    ImVec4::ImVec4(&local_38,0.6,0.6,0.6,1.0);
    local_18[1].x = local_38.x;
    local_18[1].y = local_38.y;
    local_18[1].z = local_38.z;
    local_18[1].w = local_38.w;
    ImVec4::ImVec4(&local_48,0.96,0.96,0.94,1.0);
    local_18[2].x = local_48.x;
    local_18[2].y = local_48.y;
    local_18[2].z = local_48.z;
    local_18[2].w = local_48.w;
    ImVec4::ImVec4(&local_58,1.0,0.4,0.0,1.0);
    local_18[10].x = local_58.x;
    local_18[10].y = local_58.y;
    local_18[10].z = local_58.z;
    local_18[10].w = local_58.w;
    ImVec4::ImVec4(&local_68,1.0,0.4,0.0,1.0);
    local_18[0xb].x = local_68.x;
    local_18[0xb].y = local_68.y;
    local_18[0xb].z = local_68.z;
    local_18[0xb].w = local_68.w;
    ImVec4::ImVec4(&local_78,0.69,0.25,0.0,1.0);
    local_18[0xc].x = local_78.x;
    local_18[0xc].y = local_78.y;
    local_18[0xc].z = local_78.z;
    local_18[0xc].w = local_78.w;
    ImVec4::ImVec4(&local_88,0.96,0.96,0.94,1.0);
    local_18[3].x = local_88.x;
    local_18[3].y = local_88.y;
    local_18[3].z = local_88.z;
    local_18[3].w = local_88.w;
    ImVec4::ImVec4(&local_98,0.96,0.96,0.94,1.0);
    local_18[4].x = local_98.x;
    local_18[4].y = local_98.y;
    local_18[4].z = local_98.z;
    local_18[4].w = local_98.w;
    ImVec4::ImVec4(&local_a8,0.0,0.0,0.0,0.0);
    local_18[0x34].x = local_a8.x;
    local_18[0x34].y = local_a8.y;
    local_18[0x34].z = local_a8.z;
    local_18[0x34].w = local_a8.w;
  }
  else if (iVar1 == 1) {
    ImVec4::ImVec4(&local_b8,1.0,1.0,1.0,1.0);
    local_18->x = local_b8.x;
    local_18->y = local_b8.y;
    local_18->z = local_b8.z;
    local_18->w = local_b8.w;
    ImVec4::ImVec4(&local_c8,0.6,0.6,0.6,1.0);
    local_18[1].x = local_c8.x;
    local_18[1].y = local_c8.y;
    local_18[1].z = local_c8.z;
    local_18[1].w = local_c8.w;
    ImVec4::ImVec4(&local_d8,0.1,0.1,0.1,1.0);
    local_18[2].x = local_d8.x;
    local_18[2].y = local_d8.y;
    local_18[2].z = local_d8.z;
    local_18[2].w = local_d8.w;
    ImVec4::ImVec4(&local_e8,1.0,0.4,0.0,0.5);
    local_18[10].x = local_e8.x;
    local_18[10].y = local_e8.y;
    local_18[10].z = local_e8.z;
    local_18[10].w = local_e8.w;
    ImVec4::ImVec4(&local_f8,1.0,0.4,0.0,0.5);
    local_18[0xb].x = local_f8.x;
    local_18[0xb].y = local_f8.y;
    local_18[0xb].z = local_f8.z;
    local_18[0xb].w = local_f8.w;
    ImVec4::ImVec4(&local_108,0.69,0.25,0.0,0.5);
    local_18[0xc].x = local_108.x;
    local_18[0xc].y = local_108.y;
    local_18[0xc].z = local_108.z;
    local_18[0xc].w = local_108.w;
    ImVec4::ImVec4(&local_118,0.1,0.1,0.1,1.0);
    local_18[3].x = local_118.x;
    local_18[3].y = local_118.y;
    local_18[3].z = local_118.z;
    local_18[3].w = local_118.w;
    ImVec4::ImVec4(&local_128,0.2,0.2,0.2,1.0);
    local_18[4].x = local_128.x;
    local_18[4].y = local_128.y;
    local_18[4].z = local_128.z;
    local_18[4].w = local_128.w;
    ImVec4::ImVec4(&local_138,0.0,0.0,0.0,0.0);
    local_18[0x34].x = local_138.x;
    local_18[0x34].y = local_138.y;
    local_18[0x34].z = local_138.z;
    local_18[0x34].w = local_138.w;
  }
  else if (iVar1 == 2) {
    ImVec4::ImVec4(&local_148,0.0,1.0,0.0,1.0);
    local_18->x = local_148.x;
    local_18->y = local_148.y;
    local_18->z = local_148.z;
    local_18->w = local_148.w;
    ImVec4::ImVec4(&local_158,0.6,0.6,0.6,1.0);
    local_18[1].x = local_158.x;
    local_18[1].y = local_158.y;
    local_18[1].z = local_158.z;
    local_18[1].w = local_158.w;
    ImVec4::ImVec4(&local_168,0.1,0.1,0.1,1.0);
    local_18[2].x = local_168.x;
    local_18[2].y = local_168.y;
    local_18[2].z = local_168.z;
    local_18[2].w = local_168.w;
    ImVec4::ImVec4(&local_178,0.25,0.25,0.25,1.0);
    local_18[10].x = local_178.x;
    local_18[10].y = local_178.y;
    local_18[10].z = local_178.z;
    local_18[10].w = local_178.w;
    ImVec4::ImVec4(&local_188,0.25,0.25,0.25,1.0);
    local_18[0xb].x = local_188.x;
    local_18[0xb].y = local_188.y;
    local_18[0xb].z = local_188.z;
    local_18[0xb].w = local_188.w;
    ImVec4::ImVec4(&local_198,0.5,1.0,0.5,1.0);
    local_18[0xc].x = local_198.x;
    local_18[0xc].y = local_198.y;
    local_18[0xc].z = local_198.z;
    local_18[0xc].w = local_198.w;
    ImVec4::ImVec4(&local_1a8,0.1,0.1,0.1,1.0);
    local_18[3].x = local_1a8.x;
    local_18[3].y = local_1a8.y;
    local_18[3].z = local_1a8.z;
    local_18[3].w = local_1a8.w;
    ImVec4::ImVec4(&local_1b8,0.0,0.0,0.0,1.0);
    local_18[4].x = local_1b8.x;
    local_18[4].y = local_1b8.y;
    local_18[4].z = local_1b8.z;
    local_18[4].w = local_1b8.w;
    ImVec4::ImVec4(&local_1c8,0.0,0.0,0.0,0.0);
    local_18[0x34].x = local_1c8.x;
    local_18[0x34].y = local_1c8.y;
    local_18[0x34].z = local_1c8.z;
    local_18[0x34].w = local_1c8.w;
  }
  return;
}

Assistant:

void changeColorScheme(bool inc = true) {
        if (inc) {
            colorScheme = (ColorScheme)(((int) colorScheme + 1) % ((int)ColorScheme::COUNT));
        }

        ImVec4* colors = ImGui::GetStyle().Colors;
        switch (colorScheme) {
            case ColorScheme::Default:
                {
                    colors[ImGuiCol_Text]                   = ImVec4(0.00f, 0.00f, 0.00f, 1.00f);
                    colors[ImGuiCol_TextDisabled]           = ImVec4(0.60f, 0.60f, 0.60f, 1.00f);
                    colors[ImGuiCol_WindowBg]               = ImVec4(0.96f, 0.96f, 0.94f, 1.00f);
                    colors[ImGuiCol_TitleBg]                = ImVec4(1.00f, 0.40f, 0.00f, 1.00f);
                    colors[ImGuiCol_TitleBgActive]          = ImVec4(1.00f, 0.40f, 0.00f, 1.00f);
                    colors[ImGuiCol_TitleBgCollapsed]       = ImVec4(0.69f, 0.25f, 0.00f, 1.00f);
                    colors[ImGuiCol_ChildBg]                = ImVec4(0.96f, 0.96f, 0.94f, 1.00f);
                    colors[ImGuiCol_PopupBg]                = ImVec4(0.96f, 0.96f, 0.94f, 1.00f);
                    colors[ImGuiCol_ModalWindowDimBg]       = ImVec4(0.00f, 0.00f, 0.00f, 0.00f);
                }
                break;
            case ColorScheme::Dark:
                {
                    colors[ImGuiCol_Text]                   = ImVec4(1.00f, 1.00f, 1.00f, 1.00f);
                    colors[ImGuiCol_TextDisabled]           = ImVec4(0.60f, 0.60f, 0.60f, 1.00f);
                    colors[ImGuiCol_WindowBg]               = ImVec4(0.10f, 0.10f, 0.10f, 1.00f);
                    colors[ImGuiCol_TitleBg]                = ImVec4(1.00f, 0.40f, 0.00f, 0.50f);
                    colors[ImGuiCol_TitleBgActive]          = ImVec4(1.00f, 0.40f, 0.00f, 0.50f);
                    colors[ImGuiCol_TitleBgCollapsed]       = ImVec4(0.69f, 0.25f, 0.00f, 0.50f);
                    colors[ImGuiCol_ChildBg]                = ImVec4(0.10f, 0.10f, 0.10f, 1.00f);
                    colors[ImGuiCol_PopupBg]                = ImVec4(0.20f, 0.20f, 0.20f, 1.00f);
                    colors[ImGuiCol_ModalWindowDimBg]       = ImVec4(0.00f, 0.00f, 0.00f, 0.00f);
                }
                break;
            case ColorScheme::Green:
                {
                    colors[ImGuiCol_Text]                   = ImVec4(0.00f, 1.00f, 0.00f, 1.00f);
                    colors[ImGuiCol_TextDisabled]           = ImVec4(0.60f, 0.60f, 0.60f, 1.00f);
                    colors[ImGuiCol_WindowBg]               = ImVec4(0.10f, 0.10f, 0.10f, 1.00f);
                    colors[ImGuiCol_TitleBg]                = ImVec4(0.25f, 0.25f, 0.25f, 1.00f);
                    colors[ImGuiCol_TitleBgActive]          = ImVec4(0.25f, 0.25f, 0.25f, 1.00f);
                    colors[ImGuiCol_TitleBgCollapsed]       = ImVec4(0.50f, 1.00f, 0.50f, 1.00f);
                    colors[ImGuiCol_ChildBg]                = ImVec4(0.10f, 0.10f, 0.10f, 1.00f);
                    colors[ImGuiCol_PopupBg]                = ImVec4(0.00f, 0.00f, 0.00f, 1.00f);
                    colors[ImGuiCol_ModalWindowDimBg]       = ImVec4(0.00f, 0.00f, 0.00f, 0.00f);
                }
                break;
            default:
                {
                }
        }
    }